

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::CompactMemTable(DBImpl *this)

{
  bool bVar1;
  Version *this_00;
  undefined1 local_108 [24];
  Slice local_f0;
  Status local_e0;
  undefined1 local_d8 [8];
  Status s;
  Version *base;
  VersionEdit edit;
  DBImpl *this_local;
  
  edit.new_files_.
  super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  port::Mutex::AssertHeld(&this->mutex_);
  if (this->imm_ == (MemTable *)0x0) {
    __assert_fail("imm_ != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                  ,0x218,"void leveldb::DBImpl::CompactMemTable()");
  }
  VersionEdit::VersionEdit((VersionEdit *)&base);
  this_00 = VersionSet::current(this->versions_);
  Version::Ref(this_00);
  WriteLevel0Table((DBImpl *)local_d8,(MemTable *)this,(VersionEdit *)this->imm_,(Version *)&base);
  Version::Unref(this_00);
  bVar1 = Status::ok((Status *)local_d8);
  if ((bVar1) &&
     (bVar1 = std::atomic<bool>::load(&this->shutting_down_,memory_order_acquire), bVar1)) {
    Slice::Slice(&local_f0,"Deleting DB during memtable compaction");
    Slice::Slice((Slice *)(local_108 + 8));
    Status::IOError(&local_e0,&local_f0,(Slice *)(local_108 + 8));
    Status::operator=((Status *)local_d8,&local_e0);
    Status::~Status(&local_e0);
  }
  bVar1 = Status::ok((Status *)local_d8);
  if (bVar1) {
    VersionEdit::SetPrevLogNumber((VersionEdit *)&base,0);
    VersionEdit::SetLogNumber((VersionEdit *)&base,this->logfile_number_);
    VersionSet::LogAndApply((VersionSet *)local_108,(VersionEdit *)this->versions_,(Mutex *)&base);
    Status::operator=((Status *)local_d8,(Status *)local_108);
    Status::~Status((Status *)local_108);
  }
  bVar1 = Status::ok((Status *)local_d8);
  if (bVar1) {
    MemTable::Unref(this->imm_);
    this->imm_ = (MemTable *)0x0;
    std::atomic<bool>::store(&this->has_imm_,false,memory_order_release);
    DeleteObsoleteFiles(this);
  }
  else {
    RecordBackgroundError(this,(Status *)local_d8);
  }
  Status::~Status((Status *)local_d8);
  VersionEdit::~VersionEdit((VersionEdit *)&base);
  return;
}

Assistant:

void DBImpl::CompactMemTable() {
  mutex_.AssertHeld();
  assert(imm_ != nullptr);

  // Save the contents of the memtable as a new Table
  VersionEdit edit;
  Version* base = versions_->current();
  base->Ref();
  Status s = WriteLevel0Table(imm_, &edit, base);
  base->Unref();

  if (s.ok() && shutting_down_.load(std::memory_order_acquire)) {
    s = Status::IOError("Deleting DB during memtable compaction");
  }

  // Replace immutable memtable with the generated Table
  if (s.ok()) {
    edit.SetPrevLogNumber(0);
    edit.SetLogNumber(logfile_number_);  // Earlier logs no longer needed
    s = versions_->LogAndApply(&edit, &mutex_);
  }

  if (s.ok()) {
    // Commit to the new state
    imm_->Unref();
    imm_ = nullptr;
    has_imm_.store(false, std::memory_order_release);
    DeleteObsoleteFiles();
  } else {
    RecordBackgroundError(s);
  }
}